

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O2

void __thiscall ProfileHandler::Reset(ProfileHandler *this)

{
  _List_node_base *this_00;
  _List_node_base *p_Var1;
  undefined1 local_d0 [8];
  ScopedSignalBlocker block;
  CallbackList copy;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  sl.lock_ = &this->control_lock_;
  SpinLock::Lock(sl.lock_);
  this_00 = (_List_node_base *)(block.sig_set_.__val + 0xf);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  block.sig_set_.__val[0xf] = (unsigned_long)this_00;
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = this_00;
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_d0,this->signal_number_);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node._M_size = (size_t)&this->signal_lock_;
  SpinLock::Lock((SpinLock *)
                 copy.
                 super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
                 _M_impl._M_node._M_size);
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::swap
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)this_00,
             &this->callbacks_);
  SpinLockHolder::~SpinLockHolder
            ((SpinLockHolder *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_d0);
  p_Var1 = this_00;
  while (p_Var1 = (((_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != this_00) {
    operator_delete(p_Var1[1]._M_next,0x10);
  }
  this->callback_count_ = 0;
  UpdateTimer(this,false);
  std::__cxx11::_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::_M_clear
            ((_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
             (block.sig_set_.__val + 0xf));
  SpinLockHolder::~SpinLockHolder(&sl);
  return;
}

Assistant:

void ProfileHandler::Reset() {
  SpinLockHolder cl(&control_lock_);
  CallbackList copy;
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    // Only do swap under this critical lock.
    using std::swap;
    swap(copy, callbacks_);
  }
  for (ProfileHandlerToken* token : copy) {
    delete token;
  }
  callback_count_ = 0;
  UpdateTimer(false);
  // copy gets deleted here
}